

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

bool CoreML::Specification::operator==(RepeatedField<double> *a,RepeatedField<double> *b)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  int index;
  
  if (a->current_size_ != b->current_size_) {
    return false;
  }
  if (0 < a->current_size_) {
    index = 0;
    while( true ) {
      pdVar4 = google::protobuf::RepeatedField<double>::Get(a,index);
      dVar1 = *pdVar4;
      pdVar4 = google::protobuf::RepeatedField<double>::Get(b,index);
      dVar2 = *pdVar4;
      bVar3 = (bool)(-(dVar1 == dVar2) & 1);
      if (dVar1 != dVar2) {
        return bVar3;
      }
      if (NAN(dVar1) || NAN(dVar2)) break;
      index = index + 1;
      if (a->current_size_ <= index) {
        return bVar3;
      }
    }
    return bVar3;
  }
  return true;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}